

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-properties.c
# Opt level: O0

activation * lookup_activation(char *act_name)

{
  int iVar1;
  activation *local_18;
  activation *act;
  char *act_name_local;
  
  local_18 = activations + 1;
  while ((local_18 != (activation *)0x0 && (iVar1 = strcmp(local_18->name,act_name), iVar1 != 0))) {
    local_18 = local_18->next;
  }
  return local_18;
}

Assistant:

struct activation *lookup_activation(const char *act_name)
{
	struct activation *act = &activations[1];
	while (act) {
		if (streq(act->name, act_name))
			break;
		act = act->next;
	}
	return act;
}